

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::ByteSizeLong(MapEntryImpl<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
               *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  size_t size;
  MapEntryImpl<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_local;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  iVar1 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::ByteSize((MapEntryAccessorType *)CONCAT44(extraout_var,iVar1));
  iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])();
  sVar3 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Value>
          ::ByteSize((MapEntryAccessorType *)CONCAT44(extraout_var_00,iVar2));
  return sVar3 + (long)iVar1 + 2;
}

Assistant:

size_t ByteSizeLong() const override {
    size_t size = 0;
    size += kTagSize + static_cast<size_t>(KeyTypeHandler::ByteSize(key()));
    size += kTagSize + static_cast<size_t>(ValueTypeHandler::ByteSize(value()));
    return size;
  }